

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.cxx
# Opt level: O2

bool __thiscall
cmConfigureFileCommand::InitialPass
          (cmConfigureFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *psVar1;
  pointer pbVar2;
  char *in_name;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  allocator local_1e9;
  string unknown_args;
  string msg;
  string errorMessage;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    std::__cxx11::string::string
              ((string *)&errorMessage,"called with incorrect number of arguments, expected 2",
               (allocator *)&unknown_args);
    cmCommand::SetError(&this->super_cmCommand,&errorMessage);
  }
  else {
    in_name = (pbVar2->_M_dataplus)._M_p;
    bVar3 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (!bVar3) {
      cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::assign((char *)&this->InputFile);
      std::__cxx11::string::append((char *)&this->InputFile);
    }
    psVar1 = &this->InputFile;
    std::__cxx11::string::append((char *)psVar1);
    bVar3 = cmsys::SystemTools::FileIsDirectory(psVar1);
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMessage);
      poVar5 = std::operator<<((ostream *)&errorMessage,"input location\n");
      poVar5 = std::operator<<(poVar5,"  ");
      poVar5 = std::operator<<(poVar5,(string *)psVar1);
      poVar5 = std::operator<<(poVar5,"\n");
      std::operator<<(poVar5,"is a directory but a file was expected.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&unknown_args);
      std::__cxx11::string::~string((string *)&unknown_args);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorMessage);
      return false;
    }
    bVar3 = cmsys::SystemTools::FileIsFullPath
                      ((args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    if (!bVar3) {
      cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::assign((char *)&this->OutputFile);
      std::__cxx11::string::append((char *)&this->OutputFile);
    }
    psVar1 = &this->OutputFile;
    std::__cxx11::string::append((char *)psVar1);
    bVar3 = cmsys::SystemTools::FileIsDirectory(psVar1);
    if (bVar3) {
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::string::string((string *)&unknown_args,in_name,(allocator *)&msg);
      cmsys::SystemTools::GetFilenameName(&errorMessage,&unknown_args);
      std::__cxx11::string::append((string *)psVar1);
      std::__cxx11::string::~string((string *)&errorMessage);
      std::__cxx11::string::~string((string *)&unknown_args);
    }
    bVar3 = cmMakefile::CanIWriteThisFile
                      ((this->super_cmCommand).Makefile,(this->OutputFile)._M_dataplus._M_p);
    if (bVar3) {
      errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
      errorMessage._M_string_length = 0;
      errorMessage.field_2._M_local_buf[0] = '\0';
      bVar3 = cmNewLineStyle::ReadFromArguments(&this->NewLineStyle,args,&errorMessage);
      if (bVar3) {
        this->CopyOnly = false;
        this->EscapeQuotes = false;
        unknown_args._M_dataplus._M_p = (pointer)&unknown_args.field_2;
        unknown_args._M_string_length = 0;
        unknown_args.field_2._M_local_buf[0] = '\0';
        this->AtOnly = false;
        for (uVar6 = 2;
            pbVar2 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
            uVar6 < (ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
            uVar6 = (ulong)((int)uVar6 + 1)) {
          bVar3 = std::operator==(pbVar2 + uVar6,"COPYONLY");
          if (bVar3) {
            this->CopyOnly = true;
            bVar3 = cmNewLineStyle::IsValid(&this->NewLineStyle);
            if (bVar3) {
              std::__cxx11::string::string
                        ((string *)&msg,
                         "COPYONLY could not be used in combination with NEWLINE_STYLE",&local_1e9);
              cmCommand::SetError(&this->super_cmCommand,&msg);
              goto LAB_00297035;
            }
          }
          else {
            bVar3 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar6,
                                    "ESCAPE_QUOTES");
            if (bVar3) {
              this->EscapeQuotes = true;
            }
            else {
              bVar3 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar6,"@ONLY");
              if (bVar3) {
                this->AtOnly = true;
              }
              else {
                bVar3 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar6,
                                        "IMMEDIATE");
                if ((((!bVar3) &&
                     (bVar3 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar6,
                                              "NEWLINE_STYLE"), !bVar3)) &&
                    (bVar3 = std::operator==((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + uVar6,"LF"
                                            ), !bVar3)) &&
                   (((bVar3 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar6,
                                              "UNIX"), !bVar3 &&
                     (bVar3 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar6,
                                              "CRLF"), !bVar3)) &&
                    ((bVar3 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar6,
                                              "WIN32"), !bVar3 &&
                     (bVar3 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar6,
                                              "DOS"), !bVar3)))))) {
                  std::__cxx11::string::append((char *)&unknown_args);
                  std::__cxx11::string::append((string *)&unknown_args);
                  std::__cxx11::string::append((char *)&unknown_args);
                }
              }
            }
          }
        }
        if (unknown_args._M_string_length != 0) {
          std::__cxx11::string::string
                    ((string *)&msg,"configure_file called with unknown argument(s):\n",&local_1e9);
          std::__cxx11::string::append((string *)&msg);
          cmMakefile::IssueMessage((this->super_cmCommand).Makefile,AUTHOR_WARNING,&msg);
          std::__cxx11::string::~string((string *)&msg);
        }
        iVar4 = ConfigureFile(this);
        bVar3 = true;
        if (iVar4 == 0) {
          std::__cxx11::string::string((string *)&msg,"Problem configuring file",&local_1e9);
          cmCommand::SetError(&this->super_cmCommand,&msg);
LAB_00297035:
          std::__cxx11::string::~string((string *)&msg);
          bVar3 = false;
        }
        std::__cxx11::string::~string((string *)&unknown_args);
      }
      else {
        cmCommand::SetError(&this->super_cmCommand,&errorMessage);
        bVar3 = false;
      }
      std::__cxx11::string::~string((string *)&errorMessage);
      return bVar3;
    }
    std::operator+(&unknown_args,"attempted to configure a file: ",psVar1);
    std::operator+(&errorMessage,&unknown_args," into a source directory.");
    std::__cxx11::string::~string((string *)&unknown_args);
    cmCommand::SetError(&this->super_cmCommand,&errorMessage);
    cmSystemTools::s_FatalErrorOccured = true;
  }
  std::__cxx11::string::~string((string *)&errorMessage);
  return false;
}

Assistant:

bool cmConfigureFileCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments, expected 2");
    return false;
    }

  const char* inFile = args[0].c_str();
  if(!cmSystemTools::FileIsFullPath(inFile))
    {
    this->InputFile = this->Makefile->GetCurrentSourceDirectory();
    this->InputFile += "/";
    }
  this->InputFile += inFile;

  // If the input location is a directory, error out.
  if(cmSystemTools::FileIsDirectory(this->InputFile))
    {
    std::ostringstream e;
    e << "input location\n"
      << "  " << this->InputFile << "\n"
      << "is a directory but a file was expected.";
    this->SetError(e.str());
    return false;
    }

  const char* outFile = args[1].c_str();
  if(!cmSystemTools::FileIsFullPath(outFile))
    {
    this->OutputFile = this->Makefile->GetCurrentBinaryDirectory();
    this->OutputFile += "/";
    }
  this->OutputFile += outFile;

  // If the output location is already a directory put the file in it.
  if(cmSystemTools::FileIsDirectory(this->OutputFile))
    {
    this->OutputFile += "/";
    this->OutputFile += cmSystemTools::GetFilenameName(inFile);
    }

  if ( !this->Makefile->CanIWriteThisFile(this->OutputFile.c_str()) )
    {
    std::string e = "attempted to configure a file: " + this->OutputFile
      + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }
  std::string errorMessage;
  if (!this->NewLineStyle.ReadFromArguments(args, errorMessage))
    {
    this->SetError(errorMessage);
    return false;
    }
  this->CopyOnly = false;
  this->EscapeQuotes = false;

  std::string unknown_args;
  this->AtOnly = false;
  for(unsigned int i=2;i < args.size();++i)
    {
    if(args[i] == "COPYONLY")
      {
      this->CopyOnly = true;
      if (this->NewLineStyle.IsValid())
        {
        this->SetError("COPYONLY could not be used in combination "
                       "with NEWLINE_STYLE");
        return false;
        }
      }
    else if(args[i] == "ESCAPE_QUOTES")
      {
      this->EscapeQuotes = true;
      }
    else if(args[i] == "@ONLY")
      {
      this->AtOnly = true;
      }
    else if(args[i] == "IMMEDIATE")
      {
      /* Ignore legacy option.  */
      }
    else if(args[i] == "NEWLINE_STYLE" ||
            args[i] == "LF" || args[i] == "UNIX" ||
            args[i] == "CRLF" || args[i] == "WIN32" ||
            args[i] == "DOS")
      {
      /* Options handled by NewLineStyle member above.  */
      }
    else
      {
      unknown_args += " ";
      unknown_args += args[i];
      unknown_args += "\n";
      }
    }
  if (!unknown_args.empty())
    {
    std::string msg = "configure_file called with unknown argument(s):\n";
    msg += unknown_args;
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, msg);
    }

  if ( !this->ConfigureFile() )
    {
    this->SetError("Problem configuring file");
    return false;
    }

  return true;
}